

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  byte *pbVar2;
  int iVar3;
  Curl_HttpReq CVar4;
  CURLcode CVar5;
  byte *pbVar6;
  undefined7 in_register_00000031;
  char *pcVar7;
  Curl_send_buffer *pCVar8;
  long lVar9;
  byte *pbVar10;
  bool bVar11;
  curl_slist *h [2];
  long local_58;
  Curl_send_buffer *local_48;
  curl_slist *local_40;
  Curl_send_buffer *local_38;
  
  local_38 = req_buffer;
  pCVar1 = conn->data;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    if (((conn->bits).httpproxy == true) && ((conn->bits).tunnel_proxy == false)) {
      local_48 = (Curl_send_buffer *)(pCVar1->set).headers;
      local_58 = 1;
      if ((pCVar1->set).sep_headers == true) {
        local_40 = (pCVar1->set).proxyheaders;
        local_58 = 2;
      }
      goto LAB_0047ff9f;
    }
LAB_0047ff8a:
    local_48 = (Curl_send_buffer *)(pCVar1->set).headers;
  }
  else {
    if ((pCVar1->set).sep_headers != true) goto LAB_0047ff8a;
    local_48 = (Curl_send_buffer *)(pCVar1->set).proxyheaders;
  }
  local_58 = 1;
LAB_0047ff9f:
  lVar9 = 0;
  do {
    for (pCVar8 = (&local_48)[lVar9]; pCVar8 != (Curl_send_buffer *)0x0;
        pCVar8 = (Curl_send_buffer *)pCVar8->size_max) {
      pcVar7 = pCVar8->buffer;
      pbVar6 = (byte *)strchr(pcVar7,0x3a);
      if (pbVar6 == (byte *)0x0) {
        pbVar6 = (byte *)strchr(pcVar7,0x3b);
        pbVar2 = pbVar6;
        if (pbVar6 != (byte *)0x0) {
          do {
            pbVar10 = pbVar2;
            if (pbVar10[1] == 0) goto LAB_00480142;
            iVar3 = Curl_isspace((uint)pbVar10[1]);
            pbVar2 = pbVar10 + 1;
          } while (iVar3 != 0);
          if (pbVar10[1] == 0) {
LAB_00480142:
            if (*pbVar10 != 0x3b) goto LAB_0047ffd2;
            *pbVar10 = 0x3a;
            goto LAB_0047ffd8;
          }
        }
      }
      else {
LAB_0047ffd2:
        pbVar10 = (byte *)0x0;
LAB_0047ffd8:
        do {
          pbVar6 = pbVar6 + 1;
          if (*pbVar6 == 0) {
            bVar11 = false;
            goto LAB_0047fff9;
          }
          iVar3 = Curl_isspace((uint)*pbVar6);
        } while (iVar3 != 0);
        bVar11 = *pbVar6 != 0;
LAB_0047fff9:
        if ((pbVar10 != (byte *)0x0) || (bVar11)) {
          pcVar7 = pCVar8->buffer;
          if ((conn->allocptr).host == (char *)0x0) {
LAB_00480031:
            CVar4 = (pCVar1->set).httpreq;
            if (CVar4 == HTTPREQ_POST_FORM) {
              iVar3 = curl_strnequal("Content-Type:",pcVar7,0xd);
              if (iVar3 != 0) goto LAB_004800ee;
              CVar4 = (pCVar1->set).httpreq;
              pcVar7 = pCVar8->buffer;
            }
            if (CVar4 == HTTPREQ_POST_MIME) {
              iVar3 = curl_strnequal("Content-Type:",pcVar7,0xd);
              if (iVar3 != 0) goto LAB_004800ee;
              pcVar7 = pCVar8->buffer;
            }
            if ((conn->bits).authneg == true) {
              iVar3 = curl_strnequal("Content-Length:",pcVar7,0xf);
              if (iVar3 != 0) goto LAB_004800ee;
              pcVar7 = pCVar8->buffer;
            }
            if ((conn->allocptr).te != (char *)0x0) {
              iVar3 = curl_strnequal("Connection:",pcVar7,0xb);
              if (iVar3 != 0) goto LAB_004800ee;
              pcVar7 = pCVar8->buffer;
            }
            if (conn->httpversion == 0x14) {
              iVar3 = curl_strnequal("Transfer-Encoding:",pcVar7,0x12);
              if (iVar3 != 0) goto LAB_004800ee;
              pcVar7 = pCVar8->buffer;
            }
            iVar3 = curl_strnequal("Authorization:",pcVar7,0xe);
            if ((((iVar3 != 0) && ((pCVar1->state).this_is_a_follow == true)) &&
                (pcVar7 = (pCVar1->state).first_host, pcVar7 != (char *)0x0)) &&
               (((pCVar1->set).allow_auth_to_other_hosts == false &&
                (iVar3 = Curl_strcasecompare(pcVar7,(conn->host).name), iVar3 == 0))))
            goto LAB_004800ee;
            CVar5 = Curl_add_bufferf(&local_38,"%s\r\n",pCVar8->buffer);
          }
          else {
            iVar3 = curl_strnequal("Host:",pcVar7,5);
            if (iVar3 == 0) {
              pcVar7 = pCVar8->buffer;
              goto LAB_00480031;
            }
LAB_004800ee:
            CVar5 = CURLE_OK;
          }
          if (pbVar10 != (byte *)0x0) {
            *pbVar10 = 0x3b;
          }
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
        }
      }
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == local_58) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              semicolonp = ptr;
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", headers->data))
            ;
          else if((conn->httpversion == 20) &&
                  checkprefix("Transfer-Encoding:", headers->data))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if(checkprefix("Authorization:", headers->data) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", headers->data);
          }
          if(semicolonp)
            *semicolonp = ';'; /* put back the semicolon */
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}